

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void highbd_down2_symodd(uint16_t *input,int length,uint16_t *output,int bd)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t *in_RDX;
  int in_ESI;
  long in_RDI;
  int sum_3;
  int sum_2;
  int sum_1;
  int sum;
  int l2;
  int l1;
  uint16_t *optr;
  int j;
  int i;
  int filter_len_half;
  uint in_stack_ffffffffffffff7c;
  long in_stack_ffffffffffffff80;
  uint16_t *local_30;
  int local_28;
  int local_24;
  
  iVar2 = (in_ESI - 3U & 1) + (in_ESI - 3U);
  if (iVar2 < 4) {
    local_30 = in_RDX;
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 2) {
      for (local_28 = 1; local_28 < 4; local_28 = local_28 + 1) {
      }
      uVar1 = clip_pixel_highbd((int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *local_30 = uVar1;
      local_30 = local_30 + 1;
    }
  }
  else {
    local_30 = in_RDX;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 2) {
      for (local_28 = 1; local_28 < 4; local_28 = local_28 + 1) {
      }
      uVar1 = clip_pixel_highbd((int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *local_30 = uVar1;
      local_30 = local_30 + 1;
    }
    for (; local_24 < iVar2; local_24 = local_24 + 2) {
      for (local_28 = 1; local_28 < 4; local_28 = local_28 + 1) {
      }
      uVar1 = clip_pixel_highbd((int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *local_30 = uVar1;
      local_30 = local_30 + 1;
    }
    for (; local_24 < in_ESI; local_24 = local_24 + 2) {
      for (local_28 = 1; local_28 < 4; local_28 = local_28 + 1) {
        in_stack_ffffffffffffff7c = (uint)*(ushort *)(in_RDI + (long)(local_24 - local_28) * 2);
        in_stack_ffffffffffffff80 = in_RDI;
      }
      uVar1 = clip_pixel_highbd((int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *local_30 = uVar1;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

static void highbd_down2_symodd(const uint16_t *const input, int length,
                                uint16_t *output, int bd) {
  // Actual filter len = 2 * filter_len_half - 1.
  static const int16_t *filter = av1_down2_symodd_half_filter;
  const int filter_len_half = sizeof(av1_down2_symodd_half_filter) / 2;
  int i, j;
  uint16_t *optr = output;
  int l1 = filter_len_half - 1;
  int l2 = (length - filter_len_half + 1);
  l1 += (l1 & 1);
  l2 += (l2 & 1);
  if (l1 > l2) {
    // Short input length.
    for (i = 0; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[AOMMAX(i - j, 0)] + input[AOMMIN(i + j, length - 1)]) *
               filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel_highbd(sum, bd);
    }
  } else {
    // Initial part.
    for (i = 0; i < l1; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[AOMMAX(i - j, 0)] + input[i + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel_highbd(sum, bd);
    }
    // Middle part.
    for (; i < l2; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[i + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel_highbd(sum, bd);
    }
    // End part.
    for (; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[AOMMIN(i + j, length - 1)]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel_highbd(sum, bd);
    }
  }
}